

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

Wlc_Ntk_t * Wlc_NtkDupDfsAbs(Wlc_Ntk_t *p,Vec_Int_t *vPisOld,Vec_Int_t *vPisNew,Vec_Int_t *vFlops)

{
  undefined1 *puVar1;
  ushort uVar2;
  Wlc_Obj_t *pWVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  Wlc_Ntk_t *pNew;
  Vec_Int_t *pVVar7;
  long lVar8;
  char *pcVar9;
  size_t sVar10;
  char *__dest;
  uint uVar11;
  ushort uVar12;
  int iVar13;
  long lVar14;
  
  uVar11 = p->nObjsAlloc;
  if ((p->vCopies).nCap < (int)uVar11) {
    piVar6 = (p->vCopies).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar11 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar11 << 2);
    }
    (p->vCopies).pArray = piVar6;
    if (piVar6 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = uVar11;
  }
  if (0 < (int)uVar11) {
    memset((p->vCopies).pArray,0,(ulong)uVar11 * 4);
  }
  (p->vCopies).nSize = uVar11;
  pNew = Wlc_NtkAlloc(p->pName,p->nObjsAlloc);
  iVar13 = p->fAsyncRst;
  iVar5 = p->fMemPorts;
  iVar4 = p->fEasyFfs;
  pNew->fSmtLib = p->fSmtLib;
  pNew->fAsyncRst = iVar13;
  pNew->fMemPorts = iVar5;
  pNew->fEasyFfs = iVar4;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  if (0 < vPisOld->nSize) {
    lVar14 = 0;
    do {
      iVar13 = vPisOld->pArray[lVar14];
      if (((long)iVar13 < 1) || (p->nObjsAlloc <= iVar13)) goto LAB_0036ffef;
      if ((undefined1  [24])((undefined1  [24])p->pObjs[iVar13] & (undefined1  [24])0x3f) !=
          (undefined1  [24])0x1) {
        __assert_fail("Wlc_ObjIsPi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                      ,0x430,
                      "Wlc_Ntk_t *Wlc_NtkDupDfsAbs(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      Wlc_ObjDup(pNew,p,iVar13,pVVar7);
      lVar14 = lVar14 + 1;
    } while (lVar14 < vPisOld->nSize);
  }
  if (0 < vPisNew->nSize) {
    lVar14 = 0;
    do {
      lVar8 = (long)vPisNew->pArray[lVar14];
      if ((lVar8 < 1) || (p->nObjsAlloc <= vPisNew->pArray[lVar14])) goto LAB_0036ffef;
      uVar2 = *(ushort *)(p->pObjs + lVar8);
      uVar12 = uVar2 & 0x3f;
      if (uVar12 == 1) {
        __assert_fail("!Wlc_ObjIsPi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                      ,0x438,
                      "Wlc_Ntk_t *Wlc_NtkDupDfsAbs(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      pWVar3 = p->pObjs + lVar8;
      uVar11 = pWVar3->nFanins;
      *(ushort *)pWVar3 = (uVar2 & 0xffc0) + 1;
      pWVar3->nFanins = 0;
      Wlc_ObjDup(pNew,p,(int)((ulong)((long)pWVar3 - (long)p->pObjs) >> 3) * -0x55555555,pVVar7);
      *(ushort *)pWVar3 = uVar12 | (ushort)*(undefined4 *)pWVar3 & 0xffc0;
      pWVar3->nFanins = uVar11;
      lVar14 = lVar14 + 1;
    } while (lVar14 < vPisNew->nSize);
  }
  iVar13 = vFlops->nSize;
  if (0 < iVar13) {
    lVar14 = 0;
    do {
      iVar13 = vFlops->pArray[lVar14];
      if (((long)iVar13 < 1) || (p->nObjsAlloc <= iVar13)) goto LAB_0036ffef;
      if (((undefined1  [24])((undefined1  [24])p->pObjs[iVar13] & (undefined1  [24])0x3f) ==
           (undefined1  [24])0x1) ||
         ((undefined1  [24])((undefined1  [24])p->pObjs[iVar13] & (undefined1  [24])0x3d) !=
          (undefined1  [24])0x1)) {
        __assert_fail("!Wlc_ObjIsPi(pObj) && Wlc_ObjIsCi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                      ,0x442,
                      "Wlc_Ntk_t *Wlc_NtkDupDfsAbs(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      Wlc_ObjDup(pNew,p,iVar13,pVVar7);
      lVar14 = lVar14 + 1;
      iVar13 = vFlops->nSize;
    } while (lVar14 < iVar13);
  }
  iVar5 = (p->vPos).nSize;
  if (0 < iVar5) {
    lVar14 = 0;
    do {
      iVar13 = (p->vPos).pArray[lVar14];
      if ((iVar13 < 1) || (p->nObjsAlloc <= iVar13)) goto LAB_0036ffef;
      Wlc_NtkDupDfs_rec(pNew,p,iVar13,pVVar7);
      lVar14 = lVar14 + 1;
      iVar5 = (p->vPos).nSize;
    } while (lVar14 < iVar5);
    iVar13 = vFlops->nSize;
  }
  if (0 < iVar13) {
    lVar14 = 0;
    do {
      lVar8 = (long)vFlops->pArray[lVar14];
      if ((lVar8 < 1) || (p->nObjsAlloc <= vFlops->pArray[lVar14])) goto LAB_0036ffef;
      if ((undefined1  [24])((undefined1  [24])p->pObjs[lVar8] & (undefined1  [24])0x3f) !=
          (undefined1  [24])0x3) goto LAB_0037002d;
      uVar11 = (p->pObjs[lVar8].field_10.Fanins[1] + (p->vPos).nSize) - (p->vPis).nSize;
      if (((int)uVar11 < 0) || ((p->vCos).nSize <= (int)uVar11)) goto LAB_0037000e;
      uVar11 = (p->vCos).pArray[uVar11];
      if (((int)uVar11 < 1) || ((uint)p->nObjsAlloc <= uVar11)) goto LAB_0036ffef;
      Wlc_NtkDupDfs_rec(pNew,p,uVar11,pVVar7);
      lVar14 = lVar14 + 1;
      iVar13 = vFlops->nSize;
    } while (lVar14 < iVar13);
    iVar5 = (p->vPos).nSize;
  }
  if (0 < iVar5) {
    lVar14 = 0;
    do {
      iVar13 = (p->vPos).pArray[lVar14];
      if (((long)iVar13 < 1) || (p->nObjsAlloc <= iVar13)) goto LAB_0036ffef;
      if ((p->vCopies).nSize <= iVar13) goto LAB_0037000e;
      iVar13 = (p->vCopies).pArray[iVar13];
      if (((long)iVar13 < 1) || (pNew->nObjsAlloc <= iVar13)) goto LAB_0036ffef;
      Wlc_ObjSetCo(pNew,pNew->pObjs + iVar13,0);
      lVar14 = lVar14 + 1;
    } while (lVar14 < (p->vPos).nSize);
    iVar13 = vFlops->nSize;
  }
  if (0 < iVar13) {
    lVar14 = 0;
    do {
      lVar8 = (long)vFlops->pArray[lVar14];
      if ((lVar8 < 1) || (p->nObjsAlloc <= vFlops->pArray[lVar14])) goto LAB_0036ffef;
      if ((undefined1  [24])((undefined1  [24])p->pObjs[lVar8] & (undefined1  [24])0x3f) !=
          (undefined1  [24])0x3) {
LAB_0037002d:
        __assert_fail("pObj->Type == WLC_OBJ_FO",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x156,"Wlc_Obj_t *Wlc_ObjFo2Fi(Wlc_Ntk_t *, Wlc_Obj_t *)");
      }
      uVar11 = (p->pObjs[lVar8].field_10.Fanins[1] + (p->vPos).nSize) - (p->vPis).nSize;
      if (((int)uVar11 < 0) || ((p->vCos).nSize <= (int)uVar11)) {
LAB_0037000e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar11 = (p->vCos).pArray[uVar11];
      if (((long)(int)uVar11 < 1) || ((uint)p->nObjsAlloc <= uVar11)) goto LAB_0036ffef;
      if ((p->vCopies).nSize <= (int)uVar11) goto LAB_0037000e;
      iVar13 = (p->vCopies).pArray[(int)uVar11];
      if (((long)iVar13 < 1) || (pNew->nObjsAlloc <= iVar13)) goto LAB_0036ffef;
      pWVar3 = pNew->pObjs;
      Vec_IntPush(&pNew->vCos,iVar13);
      puVar1 = &pWVar3[iVar13].field_0x1;
      *puVar1 = *puVar1 | 4;
      lVar14 = lVar14 + 1;
      iVar13 = vFlops->nSize;
    } while (lVar14 < iVar13);
  }
  if (pVVar7->pArray != (int *)0x0) {
    free(pVVar7->pArray);
    iVar13 = vFlops->nSize;
  }
  free(pVVar7);
  if (0 < iVar13) {
    lVar14 = 0;
    do {
      iVar13 = vFlops->pArray[lVar14];
      if (((long)iVar13 < 1) || (p->nObjsAlloc <= iVar13)) {
LAB_0036ffef:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      *(ushort *)(p->pObjs + iVar13) = *(ushort *)(p->pObjs + iVar13) | 0x80;
      lVar14 = lVar14 + 1;
    } while (lVar14 < vFlops->nSize);
  }
  if (p->vInits != (Vec_Int_t *)0x0) {
    pVVar7 = Wlc_ReduceMarkedInitVec(p,p->vInits);
    pNew->vInits = pVVar7;
  }
  if (p->pInits != (char *)0x0) {
    pcVar9 = Wlc_ReduceMarkedInitStr(p,p->pInits);
    pNew->pInits = pcVar9;
  }
  Wlc_NtkCleanMarks(p);
  pcVar9 = p->pSpec;
  if (pcVar9 != (char *)0x0) {
    sVar10 = strlen(pcVar9);
    __dest = (char *)malloc(sVar10 + 1);
    strcpy(__dest,pcVar9);
    pNew->pSpec = __dest;
  }
  return pNew;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkDupDfsAbs( Wlc_Ntk_t * p, Vec_Int_t * vPisOld, Vec_Int_t * vPisNew, Vec_Int_t * vFlops )
{
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj;
    Vec_Int_t * vFanins;
    int i;
    Wlc_NtkCleanCopy( p );
    pNew = Wlc_NtkAlloc( p->pName, p->nObjsAlloc );
    pNew->fSmtLib = p->fSmtLib;
    pNew->fAsyncRst = p->fAsyncRst;
    pNew->fMemPorts = p->fMemPorts;
    pNew->fEasyFfs = p->fEasyFfs;

    // duplicate marked PIs
    vFanins = Vec_IntAlloc( 100 );
    Wlc_NtkForEachObjVec( vPisOld, p, pObj, i )
    {
        assert( Wlc_ObjIsPi(pObj) );
        Wlc_ObjDup( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    }
    // duplicate additional PIs
    Wlc_NtkForEachObjVec( vPisNew, p, pObj, i )
    {
        unsigned Type = pObj->Type;
        int nFanins = Wlc_ObjFaninNum(pObj);
        assert( !Wlc_ObjIsPi(pObj) );
        pObj->Type = WLC_OBJ_PI;
        pObj->nFanins = 0;
        Wlc_ObjDup( pNew, p, Wlc_ObjId(p, pObj), vFanins );
        pObj->Type = Type;
        pObj->nFanins = (unsigned)nFanins;
    }
    // duplicate flop outputs
    Wlc_NtkForEachObjVec( vFlops, p, pObj, i )
    {
        assert( !Wlc_ObjIsPi(pObj) && Wlc_ObjIsCi(pObj) );
        Wlc_ObjDup( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    }

    // duplicate logic cones of primary outputs
    Wlc_NtkForEachPo( p, pObj, i )
        Wlc_NtkDupDfs_rec( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    // duplidate logic cone of flop inputs
    Wlc_NtkForEachObjVec( vFlops, p, pObj, i )
        Wlc_NtkDupDfs_rec( pNew, p, Wlc_ObjId(p, Wlc_ObjFo2Fi(p, pObj)), vFanins );

    // duplicate POs
    Wlc_NtkForEachPo( p, pObj, i )
        Wlc_ObjSetCo( pNew, Wlc_ObjCopyObj(pNew, p, pObj), 0 );
    // duplicate flop inputs 
    Wlc_NtkForEachObjVec( vFlops, p, pObj, i )
        Wlc_ObjSetCo( pNew, Wlc_ObjCopyObj(pNew, p, Wlc_ObjFo2Fi(p, pObj)), 1 );
    Vec_IntFree( vFanins );

    // mark flop outputs
    Wlc_NtkForEachObjVec( vFlops, p, pObj, i )
        pObj->Mark = 1;
    if ( p->vInits )
        pNew->vInits = Wlc_ReduceMarkedInitVec( p, p->vInits );
    if ( p->pInits )
        pNew->pInits = Wlc_ReduceMarkedInitStr( p, p->pInits );
    Wlc_NtkCleanMarks( p );

    if ( p->pSpec )
        pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    //Wlc_NtkTransferNames( pNew, p );
    return pNew;
}